

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Cues::PreloadCuePoint(Cues *this,long *cue_points_size,longlong pos)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 *puVar5;
  CuePoint *this_00;
  longlong in_RDX;
  ulong *in_RSI;
  long in_RDI;
  CuePoint *pCP;
  CuePoint **pp;
  CuePoint **p;
  CuePoint **q;
  CuePoint **qq;
  long n;
  CuePoint *local_90;
  ulong local_80;
  undefined8 *local_40;
  undefined8 *local_38;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    if ((long)*in_RSI <= *(long *)(in_RDI + 0x38)) {
      if ((long)*in_RSI < 1) {
        local_80 = 0x800;
      }
      else {
        local_80 = *in_RSI << 1;
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_80;
      uVar4 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      puVar5 = (undefined8 *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
      if (puVar5 == (undefined8 *)0x0) {
        return false;
      }
      puVar1 = *(undefined8 **)(in_RDI + 0x28);
      lVar2 = *(long *)(in_RDI + 0x38);
      local_40 = puVar1;
      local_38 = puVar5;
      while (local_40 != puVar1 + lVar2) {
        *local_38 = *local_40;
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
      }
      if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x28));
      }
      *(undefined8 **)(in_RDI + 0x28) = puVar5;
      *in_RSI = local_80;
    }
    this_00 = (CuePoint *)operator_new(0x30,(nothrow_t *)&std::nothrow);
    local_90 = (CuePoint *)0x0;
    if (this_00 != (CuePoint *)0x0) {
      CuePoint::CuePoint(this_00,*(long *)(in_RDI + 0x38),in_RDX);
      local_90 = this_00;
    }
    if (local_90 == (CuePoint *)0x0) {
      local_1 = false;
    }
    else {
      lVar2 = *(long *)(in_RDI + 0x38);
      *(long *)(in_RDI + 0x38) = lVar2 + 1;
      *(CuePoint **)(*(long *)(in_RDI + 0x28) + lVar2 * 8) = local_90;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Cues::PreloadCuePoint(long& cue_points_size, long long pos) const {
  if (m_count != 0)
    return false;

  if (m_preload_count >= cue_points_size) {
    const long n = (cue_points_size <= 0) ? 2048 : 2 * cue_points_size;

    CuePoint** const qq = new (std::nothrow) CuePoint*[n];
    if (qq == NULL)
      return false;

    CuePoint** q = qq;  // beginning of target

    CuePoint** p = m_cue_points;  // beginning of source
    CuePoint** const pp = p + m_preload_count;  // end of source

    while (p != pp)
      *q++ = *p++;

    delete[] m_cue_points;

    m_cue_points = qq;
    cue_points_size = n;
  }

  CuePoint* const pCP = new (std::nothrow) CuePoint(m_preload_count, pos);
  if (pCP == NULL)
    return false;

  m_cue_points[m_preload_count++] = pCP;
  return true;
}